

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O0

Value * apply_addition_operation(Value *left_value,Value *right_value)

{
  char *__s;
  char *__s_00;
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  Value **items;
  int local_98;
  int local_94;
  int i_1;
  int i;
  size_t right_array_item_length;
  size_t left_array_item_length;
  Value **result_items;
  Value **right_array_items;
  Value **left_array_items;
  longdouble right_float;
  longdouble left_float;
  char *result_string;
  size_t length;
  char *s2;
  char *s1;
  Value *right_value_local;
  Value *left_value_local;
  
  if ((left_value->value_type == ValueTypeStringValue) ||
     (right_value->value_type == ValueTypeStringValue)) {
    __s = convert_to_string(left_value);
    __s_00 = convert_to_string(right_value);
    sVar1 = strlen(__s);
    sVar2 = strlen(__s_00);
    __dest = (char *)calloc(sVar1 + sVar2 + 1,1);
    strcpy(__dest,__s);
    strcat(__dest,__s_00);
    free(__s);
    free(__s_00);
    left_value_local = new_string_value(__dest,sVar1 + sVar2);
  }
  else if (((left_value->value_type == ValueTypeIntegerValue) ||
           (left_value->value_type == ValueTypeFloatValue)) &&
          ((right_value->value_type == ValueTypeIntegerValue ||
           (right_value->value_type == ValueTypeFloatValue)))) {
    if ((left_value->value_type == ValueTypeIntegerValue) &&
       (right_value->value_type == ValueTypeIntegerValue)) {
      left_value_local = new_integer_value(*(long *)(left_value + 1) + *(long *)(right_value + 1));
    }
    else {
      if (left_value->value_type == ValueTypeFloatValue) {
        unique0x00006f00 = *(longdouble *)&left_value[1].linked_variable_count;
      }
      else {
        register0x00001100 = (longdouble)*(long *)(left_value + 1);
      }
      if (right_value->value_type == ValueTypeFloatValue) {
        _left_array_items = *(longdouble *)&right_value[1].linked_variable_count;
      }
      else {
        _left_array_items = (longdouble)*(long *)(right_value + 1);
      }
      left_value_local = new_float_value(_left_array_items + stack0xffffffffffffffa8);
    }
  }
  else if (((left_value->value_type == ValueTypeTupleValue) ||
           (left_value->value_type == ValueTypeListValue)) &&
          ((right_value->value_type == ValueTypeTupleValue ||
           (right_value->value_type == ValueTypeListValue)))) {
    if (left_value->value_type == ValueTypeListValue) {
      right_array_items = *(Value ***)(left_value + 1);
      right_array_item_length = left_value[1].linked_variable_count;
    }
    else {
      right_array_items = *(Value ***)(left_value + 1);
      right_array_item_length = left_value[1].linked_variable_count;
    }
    if (right_value->value_type == ValueTypeListValue) {
      result_items = *(Value ***)(right_value + 1);
      _i_1 = right_value[1].linked_variable_count;
    }
    else {
      result_items = *(Value ***)(right_value + 1);
      _i_1 = right_value[1].linked_variable_count;
    }
    items = (Value **)malloc((right_array_item_length + _i_1) * 8);
    for (local_94 = 0; (ulong)(long)local_94 < right_array_item_length; local_94 = local_94 + 1) {
      items[local_94] = right_array_items[local_94];
      items[local_94]->linked_variable_count = items[local_94]->linked_variable_count + 1;
    }
    for (local_98 = 0; (ulong)(long)local_98 < _i_1; local_98 = local_98 + 1) {
      items[(long)local_98 + right_array_item_length] = result_items[local_98];
      items[(long)local_98 + right_array_item_length]->linked_variable_count =
           items[(long)local_98 + right_array_item_length]->linked_variable_count + 1;
    }
    left_value_local = new_list_value(items,right_array_item_length + _i_1,true);
  }
  else {
    left_value_local = new_null_value();
  }
  return left_value_local;
}

Assistant:

Value *apply_addition_operation(Value *left_value, Value *right_value) {
  if (left_value->value_type == ValueTypeStringValue || right_value->value_type == ValueTypeStringValue) {
    char *s1 = convert_to_string(left_value);
    char *s2 = convert_to_string(right_value);

    size_t length = strlen(s1) + strlen(s2);

    char *result_string = calloc(length + 1, sizeof(char));

    strcpy(result_string, s1);
    strcat(result_string, s2);

    free(s1);
    free(s2);

    return new_string_value(result_string, length);
  }
  else if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    if (left_value->value_type == ValueTypeIntegerValue && right_value->value_type == ValueTypeIntegerValue) {
      return new_integer_value(((IntegerValue *) left_value)->integer_value + ((IntegerValue *) right_value)->integer_value);
    }
    else {
      long double left_float, right_float;

      if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
      else left_float = ((IntegerValue *) left_value)->integer_value;

      if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
      else right_float = ((IntegerValue *) right_value)->integer_value;

      return new_float_value(left_float + right_float);
    }
  }
  else if ((left_value->value_type == ValueTypeTupleValue || left_value->value_type == ValueTypeListValue) && (right_value->value_type == ValueTypeTupleValue || right_value->value_type == ValueTypeListValue)) {
    Value **left_array_items, **right_array_items, **result_items;
    size_t left_array_item_length, right_array_item_length;

    if (left_value->value_type == ValueTypeListValue) {
      left_array_items = ((ListValue *) left_value)->items;
      left_array_item_length = ((ListValue *) left_value)->length;
    }
    else {
      left_array_items = ((TupleValue *) left_value)->items;
      left_array_item_length = ((TupleValue *) left_value)->length;
    }

    if (right_value->value_type == ValueTypeListValue) {
      right_array_items = ((ListValue *) right_value)->items;
      right_array_item_length = ((ListValue *) right_value)->length;
    }
    else {
      right_array_items = ((TupleValue *) right_value)->items;
      right_array_item_length = ((TupleValue *) right_value)->length;
    }

    result_items = malloc((left_array_item_length + right_array_item_length) * sizeof(Value *));

    for (int i = 0; i < left_array_item_length; i++) {
      result_items[i] = left_array_items[i];
      result_items[i]->linked_variable_count++;
    }

    for (int i = 0; i < right_array_item_length; i++) {
      result_items[i + left_array_item_length] = right_array_items[i];
      result_items[i + left_array_item_length]->linked_variable_count++;
    }

    return new_list_value(result_items, left_array_item_length + right_array_item_length, true);
  }

  return new_null_value();
}